

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debugger.cpp
# Opt level: O2

JsValueRef
Debugger::Evaluate(JsValueRef callee,bool isConstructCall,JsValueRef *arguments,
                  unsigned_short argumentCount,void *callbackState)

{
  JsErrorCode jsErrorCode;
  PAL_FILE *pPVar1;
  LPCWSTR pWVar2;
  JsValueRef local_30;
  JsValueRef result;
  int stackFrameIndex;
  
  local_30 = (JsValueRef)0x0;
  if (argumentCount < 3) {
    local_30 = (JsValueRef)0x0;
  }
  else {
    jsErrorCode = (*ChakraRTInterface::m_jsApiHooks.pfJsrtNumberToInt)
                            (arguments[1],(int *)((long)&result + 4));
    if (jsErrorCode == JsNoError) {
      (*ChakraRTInterface::m_jsApiHooks.pfJsrtDiagEvaluate)
                (arguments[2],result._4_4_,JsParseScriptAttributeNone,false,&local_30);
    }
    else {
      pPVar1 = PAL_get_stderr(0);
      pWVar2 = Helpers::JsErrorCodeToString(jsErrorCode);
      PAL_fwprintf(pPVar1,
                   L"ERROR: ChakraRTInterface::JsNumberToInt(arguments[1], &stackFrameIndex) failed. JsErrorCode=0x%x (%s)\n"
                   ,(ulong)jsErrorCode,pWVar2);
      pPVar1 = PAL_get_stderr(0);
      PAL_fflush(pPVar1);
      local_30 = (JsValueRef)0x0;
    }
  }
  return local_30;
}

Assistant:

JsValueRef Debugger::Evaluate(JsValueRef callee, bool isConstructCall, JsValueRef *arguments, unsigned short argumentCount, void *callbackState)
{
    int stackFrameIndex;
    JsValueRef result = JS_INVALID_REFERENCE;

    if (argumentCount > 2)
    {
        IfJsErrorFailLogAndRet(ChakraRTInterface::JsNumberToInt(arguments[1], &stackFrameIndex));
        ChakraRTInterface::JsDiagEvaluate(arguments[2], stackFrameIndex, JsParseScriptAttributeNone, /* forceSetValueProp */ false, &result);
    }

    return result;
}